

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

FT_Error compute_glyph_metrics(TT_Loader loader,FT_UInt glyph_index)

{
  TT_Face pTVar1;
  int iVar2;
  FT_Error FVar3;
  FT_Int32 FVar4;
  FT_Long FVar5;
  ulong uVar6;
  undefined1 auStack_a0 [4];
  FT_Error error;
  FT_Incremental_MetricsRec incr_metrics;
  FT_Incremental_InterfaceRec *incr;
  FT_Pos height;
  FT_Pos advance;
  FT_Pos top;
  FT_Fixed y_scale;
  FT_BBox bbox;
  TT_GlyphSlot glyph;
  TT_Size size;
  TT_Face face;
  FT_UInt glyph_index_local;
  TT_Loader loader_local;
  
  pTVar1 = loader->face;
  bbox.yMax = (FT_Pos)loader->glyph;
  top = 0x10000;
  if ((loader->load_flags & 1) == 0) {
    top = loader->size->metrics->y_scale;
  }
  if (((FT_GlyphSlot)bbox.yMax)->format == FT_GLYPH_FORMAT_COMPOSITE) {
    y_scale = (loader->bbox).xMin;
    bbox.xMin = (loader->bbox).yMin;
    bbox.yMin = (loader->bbox).xMax;
    bbox.xMax = (loader->bbox).yMax;
  }
  else {
    FT_Outline_Get_CBox(&((FT_GlyphSlot)bbox.yMax)->outline,(FT_BBox *)&y_scale);
  }
  *(long *)(bbox.yMax + 0x70) = (long)loader->linear;
  *(FT_Fixed *)(bbox.yMax + 0x40) = y_scale;
  *(FT_Pos *)(bbox.yMax + 0x48) = bbox.xMax;
  if (loader->widthp == (FT_Byte *)0x0) {
    *(FT_Pos *)(bbox.yMax + 0x50) = (loader->pp2).x - (loader->pp1).x;
  }
  else {
    *(long *)(bbox.yMax + 0x50) = (long)(int)((uint)loader->widthp[glyph_index] << 6);
  }
  *(FT_Pos *)(bbox.yMax + 0x30) = bbox.yMin - y_scale;
  *(FT_Pos *)(bbox.yMax + 0x38) = bbox.xMax - bbox.xMin;
  if ((pTVar1->vertical_info == '\0') || ((pTVar1->vertical).number_Of_VMetrics == 0)) {
    FVar5 = FT_DivFix(bbox.xMax - bbox.xMin,top);
    if ((pTVar1->os2).version == 0xffff) {
      iVar2 = (int)(pTVar1->horizontal).Ascender - (int)(pTVar1->horizontal).Descender;
    }
    else {
      iVar2 = (int)(pTVar1->os2).sTypoAscender - (int)(pTVar1->os2).sTypoDescender;
    }
    height = (FT_Pos)iVar2;
    advance = (height - (short)FVar5) / 2;
  }
  else {
    FVar5 = FT_DivFix((loader->pp3).y - bbox.xMax,top);
    advance = (FT_Pos)(short)FVar5;
    if ((loader->pp4).y < (loader->pp3).y) {
      uVar6 = FT_DivFix((loader->pp3).y - (loader->pp4).y,top);
      height = uVar6 & 0xffff;
    }
    else {
      height = 0;
    }
  }
  incr_metrics.advance_v = (FT_Long)((pTVar1->root).internal)->incremental_interface;
  if (((FT_Incremental_InterfaceRec *)incr_metrics.advance_v != (FT_Incremental_InterfaceRec *)0x0)
     && (((FT_Incremental_InterfaceRec *)incr_metrics.advance_v)->funcs->get_glyph_metrics !=
         (FT_Incremental_GetGlyphMetricsFunc)0x0)) {
    _auStack_a0 = 0;
    incr_metrics.bearing_x = advance;
    incr_metrics.bearing_y = height;
    FVar3 = (*((FT_Incremental_InterfaceRec *)incr_metrics.advance_v)->funcs->get_glyph_metrics)
                      (((FT_Incremental_InterfaceRec *)incr_metrics.advance_v)->object,glyph_index,
                       '\x01',(FT_Incremental_MetricsRec *)auStack_a0);
    if (FVar3 != 0) {
      return FVar3;
    }
    advance = incr_metrics.bearing_x;
    height = incr_metrics.bearing_y;
  }
  *(FT_Pos *)(bbox.yMax + 0x78) = height;
  if ((loader->load_flags & 1) == 0) {
    FVar4 = FT_MulFix_x86_64((FT_Int32)advance,(FT_Int32)top);
    advance = (FT_Pos)FVar4;
    FVar4 = FT_MulFix_x86_64((FT_Int32)height,(FT_Int32)top);
    height = (FT_Pos)FVar4;
  }
  *(long *)(bbox.yMax + 0x58) = *(long *)(bbox.yMax + 0x40) - *(long *)(bbox.yMax + 0x50) / 2;
  *(FT_Pos *)(bbox.yMax + 0x60) = advance;
  *(FT_Pos *)(bbox.yMax + 0x68) = height;
  return 0;
}

Assistant:

static FT_Error
  compute_glyph_metrics( TT_Loader  loader,
                         FT_UInt    glyph_index )
  {
    TT_Face       face  = loader->face;
    TT_Size       size  = loader->size;
    TT_GlyphSlot  glyph = loader->glyph;
    FT_BBox       bbox;
    FT_Fixed      y_scale;


    y_scale = 0x10000L;
    if ( ( loader->load_flags & FT_LOAD_NO_SCALE ) == 0 )
      y_scale = size->metrics->y_scale;

    if ( glyph->format != FT_GLYPH_FORMAT_COMPOSITE )
      FT_Outline_Get_CBox( &glyph->outline, &bbox );
    else
      bbox = loader->bbox;

    /* get the device-independent horizontal advance; it is scaled later */
    /* by the base layer.                                                */
    glyph->linearHoriAdvance = loader->linear;

    glyph->metrics.horiBearingX = bbox.xMin;
    glyph->metrics.horiBearingY = bbox.yMax;
    if ( loader->widthp )
      glyph->metrics.horiAdvance = loader->widthp[glyph_index] * 64;
    else
      glyph->metrics.horiAdvance = SUB_LONG( loader->pp2.x, loader->pp1.x );

    /* set glyph dimensions */
    glyph->metrics.width  = SUB_LONG( bbox.xMax, bbox.xMin );
    glyph->metrics.height = SUB_LONG( bbox.yMax, bbox.yMin );

    /* Now take care of vertical metrics.  In the case where there is */
    /* no vertical information within the font (relatively common),   */
    /* create some metrics manually                                   */
    {
      FT_Pos  top;      /* scaled vertical top side bearing  */
      FT_Pos  advance;  /* scaled vertical advance height    */


      /* Get the unscaled top bearing and advance height. */
      if ( face->vertical_info                   &&
           face->vertical.number_Of_VMetrics > 0 )
      {
        top = (FT_Short)FT_DivFix( SUB_LONG( loader->pp3.y, bbox.yMax ),
                                   y_scale );

        if ( loader->pp3.y <= loader->pp4.y )
          advance = 0;
        else
          advance = (FT_UShort)FT_DivFix( SUB_LONG( loader->pp3.y,
                                                    loader->pp4.y ),
                                          y_scale );
      }
      else
      {
        FT_Pos  height;


        /* XXX Compute top side bearing and advance height in  */
        /*     Get_VMetrics instead of here.                   */

        /* NOTE: The OS/2 values are the only `portable' ones, */
        /*       which is why we use them, if there is an OS/2 */
        /*       table in the font.  Otherwise, we use the     */
        /*       values defined in the horizontal header.      */

        height = (FT_Short)FT_DivFix( SUB_LONG( bbox.yMax,
                                                bbox.yMin ),
                                      y_scale );
        if ( face->os2.version != 0xFFFFU )
          advance = (FT_Pos)( face->os2.sTypoAscender -
                              face->os2.sTypoDescender );
        else
          advance = (FT_Pos)( face->horizontal.Ascender -
                              face->horizontal.Descender );

        top = ( advance - height ) / 2;
      }

#ifdef FT_CONFIG_OPTION_INCREMENTAL
      {
        FT_Incremental_InterfaceRec*  incr;
        FT_Incremental_MetricsRec     incr_metrics;
        FT_Error                      error;


        incr = face->root.internal->incremental_interface;

        /* If this is an incrementally loaded font see if there are */
        /* overriding metrics for this glyph.                       */
        if ( incr && incr->funcs->get_glyph_metrics )
        {
          incr_metrics.bearing_x = 0;
          incr_metrics.bearing_y = top;
          incr_metrics.advance   = advance;

          error = incr->funcs->get_glyph_metrics( incr->object,
                                                  glyph_index,
                                                  TRUE,
                                                  &incr_metrics );
          if ( error )
            return error;

          top     = incr_metrics.bearing_y;
          advance = incr_metrics.advance;
        }
      }

      /* GWW: Do vertical metrics get loaded incrementally too? */

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

      glyph->linearVertAdvance = advance;

      /* scale the metrics */
      if ( !( loader->load_flags & FT_LOAD_NO_SCALE ) )
      {
        top     = FT_MulFix( top,     y_scale );
        advance = FT_MulFix( advance, y_scale );
      }

      /* XXX: for now, we have no better algorithm for the lsb, but it */
      /*      should work fine.                                        */
      /*                                                               */
      glyph->metrics.vertBearingX = SUB_LONG( glyph->metrics.horiBearingX,
                                              glyph->metrics.horiAdvance / 2 );
      glyph->metrics.vertBearingY = top;
      glyph->metrics.vertAdvance  = advance;
    }

    return FT_Err_Ok;
  }